

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::internal::
BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_1,_false>_>,_1,_-1,_true,_true>
::BlockImpl_dense(BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>_>,_1,__1,_true,_true>
                  *this,Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>_>
                        *xpr,Index i)

{
  long lVar1;
  Index IVar2;
  
  MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_1,_false>_>,_1,_-1,_true>,_0>
  ::MapBase(&this->
             super_MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>_>,_1,__1,_true>,_0>
            ,(xpr->m_matrix).
             super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>
             .super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
             super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>
             .m_data + i * (xpr->m_matrix).
                           super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>
                           .m_outerStride,1,
            (xpr->m_matrix).
            super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
            super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>
            .m_rows.m_value);
  lVar1 = (xpr->m_matrix).
          super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>.
          m_rows.m_value;
  (this->m_xpr).m_matrix.
  super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>.m_data =
       (xpr->m_matrix).
       super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>.
       m_data;
  (this->m_xpr).m_matrix.
  super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>.m_rows.
  m_value = lVar1;
  IVar2 = (xpr->m_matrix).
          super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
          m_outerStride;
  (this->m_xpr).m_matrix.
  super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.m_xpr =
       (xpr->m_matrix).
       super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.m_xpr;
  (this->m_xpr).m_matrix.
  super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
  m_outerStride = IVar2;
  this->m_outerStride =
       (this->m_xpr).m_matrix.
       super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
       m_outerStride;
  return;
}

Assistant:

inline BlockImpl_dense(XprType& xpr, Index i)
      : Base(internal::const_cast_ptr(&xpr.coeffRef(
              (BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) ? i : 0,
              (BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) ? i : 0)),
             BlockRows==1 ? 1 : xpr.rows(),
             BlockCols==1 ? 1 : xpr.cols()),
        m_xpr(xpr)
    {
      init();
    }